

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O0

void __thiscall c4::yml::Tree::to_map(Tree *this,size_t node,type_bits more_flags)

{
  code *pcVar1;
  Location loc;
  bool bVar2;
  error_flags eVar3;
  size_t sVar4;
  NodeData *pNVar5;
  undefined8 in_RSI;
  size_t in_RDI;
  char msg_1 [62];
  char msg [37];
  size_t in_stack_fffffffffffffe78;
  Tree *in_stack_fffffffffffffe80;
  char *in_stack_fffffffffffffe88;
  Tree *in_stack_fffffffffffffe90;
  char *in_stack_fffffffffffffe98;
  Location *in_stack_fffffffffffffea0;
  Location *this_00;
  undefined4 in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed4;
  undefined4 uStack_128;
  undefined4 uStack_124;
  undefined4 in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee4;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  size_t in_stack_fffffffffffffef0;
  csubstr in_stack_fffffffffffffef8;
  undefined4 local_c0;
  undefined4 uStack_bc;
  undefined4 uStack_b8;
  undefined4 uStack_b4;
  undefined4 local_b0;
  undefined4 uStack_ac;
  undefined4 uStack_a8;
  undefined4 uStack_a4;
  char *local_a0;
  undefined1 local_98 [56];
  undefined8 local_60;
  Tree *pTStack_48;
  char *local_40;
  Tree *pTStack_38;
  char *local_30;
  undefined8 local_28;
  size_t local_18;
  NodeData *local_8;
  
  local_60 = in_RSI;
  bVar2 = has_children(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  if (bVar2) {
    memcpy(local_98,"check failed: (! has_children(node))",0x25);
    eVar3 = get_error_flags();
    if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
      trap_instruction();
    }
    pcVar1 = *(code **)(in_RDI + 0x58);
    Location::Location(in_stack_fffffffffffffea0,in_stack_fffffffffffffe98,
                       (size_t)in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
                       (size_t)in_stack_fffffffffffffe80);
    in_stack_fffffffffffffe88 = (char *)CONCAT44(uStack_ac,local_b0);
    in_stack_fffffffffffffe90 = (Tree *)CONCAT44(uStack_a4,uStack_a8);
    in_stack_fffffffffffffe78 = CONCAT44(uStack_bc,local_c0);
    in_stack_fffffffffffffe80 = (Tree *)CONCAT44(uStack_b4,uStack_b8);
    (*pcVar1)(local_98,0x25,*(undefined8 *)(in_RDI + 0x40));
    in_stack_fffffffffffffe98 = local_a0;
  }
  sVar4 = parent(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
  if (sVar4 != 0xffffffffffffffff) {
    local_28 = local_60;
    bVar2 = has_parent(in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
    if (!bVar2) {
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      Location::Location((Location *)in_stack_fffffffffffffe90,in_stack_fffffffffffffe88,
                         (size_t)in_stack_fffffffffffffe80,in_stack_fffffffffffffe78);
      loc.super_LineCol.offset._4_4_ = in_stack_fffffffffffffee4;
      loc.super_LineCol.offset._0_4_ = in_stack_fffffffffffffee0;
      loc.super_LineCol.line._0_4_ = in_stack_fffffffffffffee8;
      loc.super_LineCol.line._4_4_ = in_stack_fffffffffffffeec;
      loc.super_LineCol.col = in_stack_fffffffffffffef0;
      loc.name = in_stack_fffffffffffffef8;
      error<31ul>((char (*) [31])CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),loc);
      in_stack_fffffffffffffe80 = pTStack_48;
      in_stack_fffffffffffffe88 = local_40;
      in_stack_fffffffffffffe90 = pTStack_38;
      in_stack_fffffffffffffe98 = local_30;
    }
    pNVar5 = _p((Tree *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_RDI);
    local_18 = pNVar5->m_parent;
    local_8 = _p((Tree *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_RDI);
    if (((local_8->m_type).type & MAP) != NOTYPE) {
      memcpy(&stack0xfffffffffffffef8,
             "check failed: (parent(node) == NONE || ! parent_is_map(node))",0x3e);
      eVar3 = get_error_flags();
      if (((eVar3 & 1) != 0) && (bVar2 = is_debugger_attached(), bVar2)) {
        trap_instruction();
      }
      pcVar1 = *(code **)(in_RDI + 0x58);
      this_00 = (Location *)&stack0xfffffffffffffef8;
      Location::Location(this_00,in_stack_fffffffffffffe98,(size_t)in_stack_fffffffffffffe90,
                         (size_t)in_stack_fffffffffffffe88,(size_t)in_stack_fffffffffffffe80);
      in_stack_fffffffffffffe88 =
           (char *)CONCAT44(in_stack_fffffffffffffee4,in_stack_fffffffffffffee0);
      in_stack_fffffffffffffe90 =
           (Tree *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8);
      in_stack_fffffffffffffe80 = (Tree *)CONCAT44(uStack_124,uStack_128);
      (*pcVar1)(this_00,0x3e,*(undefined8 *)(in_RDI + 0x40));
    }
  }
  _set_flags(in_stack_fffffffffffffe90,(size_t)in_stack_fffffffffffffe88,
             (type_bits)in_stack_fffffffffffffe80);
  _p((Tree *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_RDI);
  NodeScalar::clear((NodeScalar *)in_stack_fffffffffffffe80);
  _p((Tree *)CONCAT44(in_stack_fffffffffffffed4,in_stack_fffffffffffffed0),in_RDI);
  NodeScalar::clear((NodeScalar *)in_stack_fffffffffffffe80);
  return;
}

Assistant:

void Tree::to_map(size_t node, type_bits more_flags)
{
    _RYML_CB_ASSERT(m_callbacks,  ! has_children(node));
    _RYML_CB_ASSERT(m_callbacks, parent(node) == NONE || ! parent_is_map(node)); // parent must not have children with keys
    _set_flags(node, MAP|more_flags);
    _p(node)->m_key.clear();
    _p(node)->m_val.clear();
}